

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_script.cpp
# Opt level: O0

void __thiscall
Script_IsP2wpkhScriptTest_Test::~Script_IsP2wpkhScriptTest_Test
          (Script_IsP2wpkhScriptTest_Test *this)

{
  Script_IsP2wpkhScriptTest_Test *this_local;
  
  ~Script_IsP2wpkhScriptTest_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Script, IsP2wpkhScriptTest) {
  ScriptBuilder builder;
  builder.AppendOperator(ScriptOperator::OP_0);
  builder.AppendData(ByteData("18763afd24a108d323f53ebcea974e7f7d309503"));
  Script script = builder.Build();

  EXPECT_FALSE(script.IsP2pkScript());
  EXPECT_FALSE(script.IsP2pkhScript());
  EXPECT_FALSE(script.IsP2shScript());
  EXPECT_FALSE(script.IsMultisigScript());
  EXPECT_TRUE(script.IsWitnessProgram());
  EXPECT_TRUE(script.IsP2wpkhScript());
  EXPECT_FALSE(script.IsP2wshScript());
  EXPECT_FALSE(script.IsPegoutScript());
}